

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessageDelimiter
          (ParserImpl *this,string *delimiter)

{
  bool bVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *delimiter_local;
  ParserImpl *this_local;
  
  local_20 = delimiter;
  delimiter_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"<",&local_41);
  bVar1 = TryConsume(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)local_20,">");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"{",&local_79);
    bVar1 = Consume(this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::operator=((string *)local_20,"}");
  }
  return true;
}

Assistant:

bool ConsumeMessageDelimiter(string* delimiter) {
    if (TryConsume("<")) {
      *delimiter = ">";
    } else {
      DO(Consume("{"));
      *delimiter = "}";
    }
    return true;
  }